

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_engine.cpp
# Opt level: O3

void __thiscall
polyscope::render::backend_openGL3_glfw::GLShaderProgram::~GLShaderProgram(GLShaderProgram *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  (this->super_ShaderProgram)._vptr_ShaderProgram = (_func_int **)&PTR__GLShaderProgram_005f63b8;
  (*glad_glDeleteVertexArrays)(1,&this->vaoHandle);
  p_Var1 = (this->compiledProgram).
           super___shared_ptr<polyscope::render::backend_openGL3_glfw::GLCompiledProgram,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  std::
  vector<polyscope::render::backend_openGL3_glfw::GLShaderTexture,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderTexture>_>
  ::~vector(&this->textures);
  std::
  vector<polyscope::render::backend_openGL3_glfw::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderAttribute>_>
  ::~vector(&this->attributes);
  std::
  vector<polyscope::render::backend_openGL3_glfw::GLShaderUniform,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderUniform>_>
  ::~vector(&this->uniforms);
  (this->super_ShaderProgram)._vptr_ShaderProgram = (_func_int **)&PTR__ShaderProgram_005f2d00;
  p_Var1 = (this->super_ShaderProgram).indexBuffer.
           super___shared_ptr<polyscope::render::AttributeBuffer,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    return;
  }
  return;
}

Assistant:

GLShaderProgram::~GLShaderProgram() { glDeleteVertexArrays(1, &vaoHandle); }